

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFParser.cpp
# Opt level: O2

IByteReader * __thiscall
PDFParser::WrapWithDecryptionFilter
          (PDFParser *this,PDFStreamInput *inStream,IByteReader *inToWrapStream)

{
  IPDFParserExtender *pIVar1;
  bool bVar2;
  IByteReader *pIVar3;
  IByteReader *pIVar4;
  
  bVar2 = DecryptionHelper::IsEncrypted(&this->mDecryptionHelper);
  pIVar3 = inToWrapStream;
  if (((bVar2) && (bVar2 = IsEncryptionSupported(this), bVar2)) &&
     (pIVar3 = DecryptionHelper::CreateDefaultDecryptionFilterForStream
                         (&this->mDecryptionHelper,inStream,inToWrapStream),
     pIVar3 == (IByteReader *)0x0)) {
    pIVar1 = this->mParserExtender;
    if (pIVar1 == (IPDFParserExtender *)0x0) {
      pIVar4 = (IByteReader *)0x0;
    }
    else {
      pIVar4 = (IByteReader *)(**(code **)(*(long *)pIVar1 + 0x20))(pIVar1,inStream,inToWrapStream);
    }
    pIVar3 = inToWrapStream;
    if (pIVar4 != (IByteReader *)0x0) {
      pIVar3 = pIVar4;
    }
  }
  return pIVar3;
}

Assistant:

IByteReader* PDFParser::WrapWithDecryptionFilter(PDFStreamInput* inStream, IByteReader* inToWrapStream) {
	if (IsEncrypted() && IsEncryptionSupported()) {
		// try with decryption helper
		IByteReader*  result = 	mDecryptionHelper.CreateDefaultDecryptionFilterForStream(inStream, inToWrapStream);
		if (result)
			return result;

		// try with extender
		if(mParserExtender)
			result = mParserExtender->CreateDefaultDecryptionFilterForStream(inStream, inToWrapStream);

		if (result)
			return result;
		else
			return inToWrapStream;
	}
	else {
		return inToWrapStream;
	}
}